

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise1d.cpp
# Opt level: O3

int ncnn::convolutiondepthwise1d
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int stride_w,int dilation_w,int group,int activation_type,Mat *activation_params,
              Option *opt)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  float *pfVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  float *pfVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  float *pfVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  bool bVar24;
  float fVar25;
  undefined1 extraout_var [12];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int local_fc;
  ulong local_e8;
  long local_d8;
  float *local_d0;
  ulong local_c0;
  
  uVar2 = bottom_blob->h;
  uVar18 = (ulong)uVar2;
  iVar3 = top_blob->w;
  lVar14 = (long)iVar3;
  pvVar4 = bias_data->data;
  if (pvVar4 == (void *)0x0) {
    bVar24 = true;
  }
  else {
    bVar24 = (long)bias_data->c * bias_data->cstep == 0;
  }
  if (top_blob->h == group && uVar2 == group) {
    if (0 < group) {
      pvVar5 = top_blob->data;
      sVar6 = top_blob->elemsize;
      local_d0 = (float *)bottom_blob->data;
      uVar18 = (long)bottom_blob->w * bottom_blob->elemsize;
      uVar21 = 0;
      do {
        if (0 < iVar3) {
          lVar23 = 0;
          pfVar15 = local_d0;
          do {
            uVar12 = 0;
            if (!bVar24) {
              uVar12 = (ulong)*(uint *)((long)pvVar4 + uVar21 * 4);
            }
            auVar30._8_8_ = 0;
            auVar30._0_8_ = uVar12;
            if (0 < kernel_w) {
              uVar12 = 0;
              pfVar11 = pfVar15;
              do {
                auVar30._0_4_ =
                     auVar30._0_4_ + *(float *)((long)&weight_data->data + uVar12 * 4) * *pfVar11;
                uVar12 = uVar12 + 1;
                pfVar11 = pfVar11 + dilation_w;
              } while ((uint)kernel_w != uVar12);
            }
            fVar25 = auVar30._0_4_;
            switch(activation_type) {
            case 1:
              if (fVar25 <= 0.0) {
                auVar7._12_4_ = 0;
                auVar7._0_12_ = auVar30._4_12_;
                auVar30 = auVar7 << 0x20;
              }
            default:
switchD_00540d2b_default:
              fVar27 = auVar30._0_4_;
              break;
            case 2:
              fVar27 = (float)(~-(uint)(0.0 < fVar25) & *(uint *)&activation_params->data |
                              -(uint)(0.0 < fVar25) & 0x3f800000) * fVar25;
              break;
            case 3:
              if (fVar25 <= *(float *)&activation_params->data) {
                auVar30._0_4_ = *(float *)&activation_params->data;
              }
              fVar27 = *(float *)((long)&activation_params->data + 4);
              if (auVar30._0_4_ <= fVar27) {
                fVar27 = auVar30._0_4_;
              }
              break;
            case 4:
              if (88.37626 <= fVar25) {
                fVar25 = 88.37626;
              }
              fVar25 = expf((float)(-(uint)(fVar25 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar25 < -88.37626) & (uint)-fVar25));
              fVar27 = 1.0 / (fVar25 + 1.0);
              break;
            case 5:
              fVar27 = expf(fVar25);
              fVar27 = logf(fVar27 + 1.0);
              fVar27 = tanhf(fVar27);
              fVar27 = fVar27 * fVar25;
              break;
            case 6:
              fVar1 = *(float *)&activation_params->data;
              fVar29 = *(float *)((long)&activation_params->data + 4);
              fVar28 = -fVar29 / fVar1;
              fVar27 = 0.0;
              if (fVar28 <= fVar25) {
                if (fVar28 + 1.0 / fVar1 < fVar25) goto switchD_00540d2b_default;
                fVar27 = (fVar1 * fVar25 + fVar29) * fVar25;
              }
            }
            *(float *)((long)pvVar5 + lVar23 * 4 + sVar6 * lVar14 * uVar21) = fVar27;
            lVar23 = lVar23 + 1;
            pfVar15 = pfVar15 + stride_w;
          } while (lVar23 != lVar14);
        }
        uVar21 = uVar21 + 1;
        weight_data = (Mat *)((long)&weight_data->data + (long)kernel_w * 4);
        local_d0 = (float *)((long)local_d0 + uVar18);
      } while (uVar21 != (uint)group);
    }
  }
  else {
    uVar21 = (long)(int)uVar2 / (long)group;
    uVar18 = uVar21 & 0xffffffff;
    iVar9 = (int)uVar21;
    if (0 < group) {
      uVar12 = (long)top_blob->h / (long)group;
      pvVar5 = top_blob->data;
      sVar6 = top_blob->elemsize;
      iVar10 = (int)uVar12;
      uVar18 = 0;
      local_fc = 0;
      local_c0 = 0;
      do {
        if (0 < iVar10) {
          local_d8 = (long)&weight_data->data + (long)local_fc * 4;
          local_e8 = 0;
          do {
            if (0 < iVar3) {
              lVar23 = local_e8 + local_c0 * (long)iVar10;
              lVar22 = (long)bottom_blob->w * bottom_blob->elemsize;
              pfVar15 = (float *)(lVar22 * uVar18 + (long)bottom_blob->data);
              lVar17 = 0;
              do {
                uVar16 = 0;
                if (!bVar24) {
                  uVar16 = (ulong)*(uint *)((long)pvVar4 + lVar23 * 4);
                }
                auVar31._8_8_ = 0;
                auVar31._0_8_ = uVar16;
                if (0 < iVar9) {
                  uVar16 = 0;
                  pfVar11 = pfVar15;
                  lVar13 = local_d8;
                  do {
                    if (0 < kernel_w) {
                      uVar20 = 0;
                      pfVar19 = pfVar11;
                      do {
                        auVar31._0_4_ = auVar31._0_4_ + *(float *)(lVar13 + uVar20 * 4) * *pfVar19;
                        uVar20 = uVar20 + 1;
                        pfVar19 = pfVar19 + dilation_w;
                      } while ((uint)kernel_w != uVar20);
                    }
                    uVar16 = uVar16 + 1;
                    lVar13 = lVar13 + (long)kernel_w * 4;
                    pfVar11 = (float *)((long)pfVar11 + lVar22);
                  } while (uVar16 != (uVar21 & 0xffffffff));
                }
                fVar25 = auVar31._0_4_;
                auVar26 = auVar31;
                switch(activation_type) {
                case 1:
                  if (fVar25 <= 0.0) {
                    auVar8._12_4_ = 0;
                    auVar8._0_12_ = auVar31._4_12_;
                    auVar26 = auVar8 << 0x20;
                  }
                  break;
                case 2:
                  auVar26 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar25) &
                                                   *(uint *)&activation_params->data |
                                                  -(uint)(0.0 < fVar25) & 0x3f800000) * fVar25));
                  break;
                case 3:
                  if (fVar25 <= *(float *)&activation_params->data) {
                    auVar31._0_4_ = *(float *)&activation_params->data;
                  }
                  fVar25 = *(float *)((long)&activation_params->data + 4);
                  auVar26 = auVar31;
                  if (fVar25 < auVar31._0_4_) {
LAB_00541201:
                    auVar26 = ZEXT416((uint)fVar25);
                  }
                  break;
                case 4:
                  if (88.37626 <= fVar25) {
                    fVar25 = 88.37626;
                  }
                  fVar25 = expf((float)(-(uint)(fVar25 < -88.37626) & 0x42b0c0a5 |
                                       ~-(uint)(fVar25 < -88.37626) & (uint)-fVar25));
                  auVar26 = ZEXT416((uint)(1.0 / (fVar25 + 1.0)));
                  break;
                case 5:
                  fVar27 = expf(fVar25);
                  fVar27 = logf(fVar27 + 1.0);
                  fVar27 = tanhf(fVar27);
                  auVar26._0_4_ = fVar27 * fVar25;
                  auVar26._4_12_ = extraout_var;
                  break;
                case 6:
                  fVar27 = *(float *)&activation_params->data;
                  fVar1 = *(float *)((long)&activation_params->data + 4);
                  fVar29 = -fVar1 / fVar27;
                  auVar26 = ZEXT816(0);
                  if ((fVar29 <= fVar25) && (auVar26 = auVar31, fVar25 <= fVar29 + 1.0 / fVar27)) {
                    fVar25 = (fVar27 * fVar25 + fVar1) * fVar25;
                    goto LAB_00541201;
                  }
                }
                *(int *)((long)pvVar5 + lVar17 * 4 + sVar6 * lVar14 * lVar23) = auVar26._0_4_;
                lVar17 = lVar17 + 1;
                pfVar15 = pfVar15 + stride_w;
              } while (lVar17 != lVar14);
            }
            local_e8 = local_e8 + 1;
            local_d8 = local_d8 + (long)(iVar9 * kernel_w) * 4;
          } while (local_e8 != (uVar12 & 0xffffffff));
        }
        local_c0 = local_c0 + 1;
        local_fc = local_fc + iVar10 * iVar9 * kernel_w;
        uVar18 = (ulong)(uint)((int)uVar18 + iVar9);
      } while (local_c0 != (uint)group);
    }
  }
  return (int)uVar18;
}

Assistant:

static int convolutiondepthwise1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    // depth-wise
    if (h == group && group == outh)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.row(g);
            const float* kptr = (const float*)weight_data + kernel_w * g;

            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[g];

                const float* sptr = bottom_blob.row(g) + j * stride_w;

                for (int k = 0; k < kernel_w; k++)
                {
                    float val = *sptr;
                    float w = kptr[k];
                    sum += val * w;

                    sptr += dilation_w;
                }

                outptr[j] = activation_ss(sum, activation_type, activation_params);
            }
        }
    }
    else
    {
        // group convolution
        const int h_g = h / group;
        const int outh_g = outh / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outh_g; p++)
            {
                float* outptr = top_blob.row(g * outh_g + p);
                const float* weight_data_ptr = (const float*)weight_data + kernel_w * h_g * outh_g * g;

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[outh_g * g + p];

                    const float* kptr = weight_data_ptr + kernel_w * h_g * p;

                    for (int q = 0; q < h_g; q++)
                    {
                        const float* sptr = bottom_blob.row(h_g * g + q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = *sptr;
                            float w = kptr[k];
                            sum += val * w;

                            sptr += dilation_w;
                        }

                        kptr += kernel_w;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }
            }
        }
    }

    return 0;
}